

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beast_Journal.cpp
# Opt level: O1

void __thiscall jbcoin::Logs::Sink::Sink(Sink *this,string *partition,Severity thresh,Logs *logs)

{
  pointer pcVar1;
  
  (this->super_Sink).thresh_ = thresh;
  (this->super_Sink).m_console = false;
  (this->super_Sink)._vptr_Sink = (_func_int **)&PTR__Sink_002d7358;
  this->logs_ = logs;
  (this->partition_)._M_dataplus._M_p = (pointer)&(this->partition_).field_2;
  pcVar1 = (partition->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->partition_,pcVar1,pcVar1 + partition->_M_string_length);
  return;
}

Assistant:

Journal::Sink::Sink (Severity thresh, bool console)
    : thresh_ (thresh)
    , m_console (console)
{
}